

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O0

void DebugMT::run(search *sch,multi_ex *ec)

{
  _func_void_search_ptr_size_t_float_action_bool_float *f;
  BaseTask *pBVar1;
  _func_void_search_ptr_size_t_action_float *f_00;
  _func_bool_search_ptr_size_t_action_ptr_float_ptr *f_01;
  BaseTask *unaff_retaddr;
  multi_ex *in_stack_ffffffffffffff98;
  search *in_stack_ffffffffffffffa0;
  __2 local_4b;
  __1 local_4a;
  __0 local_49;
  BaseTask local_48;
  
  Search::search::base_task(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  f = run(Search::search&,std::vector&)::$_0::operator_cast_to_function_pointer(&local_49);
  pBVar1 = Search::BaseTask::foreach_action(&local_48,f);
  f_00 = run(Search::search&,std::vector&)::$_1::operator_cast_to_function_pointer(&local_4a);
  pBVar1 = Search::BaseTask::post_prediction(pBVar1,f_00);
  f_01 = run(Search::search&,std::vector&)::$_2::operator_cast_to_function_pointer(&local_4b);
  pBVar1 = Search::BaseTask::maybe_override_prediction(pBVar1,f_01);
  Search::BaseTask::final_run(pBVar1);
  Search::BaseTask::Run(unaff_retaddr);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  sch.base_task(ec)
      .foreach_action(
          [](Search::search& /*sch*/, size_t t, float min_cost, action a, bool taken, float a_cost) -> void {
            cerr << "==DebugMT== foreach_action(t=" << t << ", min_cost=" << min_cost << ", a=" << a
                 << ", taken=" << taken << ", a_cost=" << a_cost << ")" << endl;
          })

      .post_prediction([](Search::search& /*sch*/, size_t t, action a, float a_cost) -> void {
        cerr << "==DebugMT== post_prediction(t=" << t << ", a=" << a << ", a_cost=" << a_cost << ")" << endl;
      })

      .maybe_override_prediction([](Search::search& /*sch*/, size_t t, action& a, float& a_cost) -> bool {
        cerr << "==DebugMT== maybe_override_prediction(t=" << t << ", a=" << a << ", a_cost=" << a_cost << ")" << endl;
        return false;
      })

      .final_run()

      .Run();
}